

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

bool StringFormatter<std::__cxx11::string_const&,long,Hex::Hexdumper<unsigned_char>>::
     output_hex_data<std::__cxx11::string>
               (ostream *os,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value
               )

{
  char cVar1;
  ostream *os_00;
  Hexdumper<char> local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  ostream *os_local;
  
  local_18 = value;
  value_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)os;
  cVar1 = std::ios::fill();
  if (cVar1 == '0') {
    std::ios::fill((char)value_local +
                   (char)*(undefined8 *)((value_local->_M_dataplus)._M_p + -0x18));
  }
  os_00 = (ostream *)std::ostream::operator<<(value_local,std::hex);
  local_28 = Hex::dumper<std::__cxx11::string>(local_18);
  Hex::operator<<(os_00,&local_28);
  return true;
}

Assistant:

static bool output_hex_data(std::ostream& os, const T& value)
    { 
        if constexpr (is_hexdumper_v<T>) {
            if (os.fill()=='0')
                os.fill(0); // 0 -> no spaces
            os << std::hex << value;
            return true;
        }
        else if constexpr (is_container_v<T>) {
            if constexpr (std::is_integral_v<typename T::value_type>) {
                if (os.fill()=='0')
                    os.fill(0);
                os << std::hex << Hex::dumper(value);
                return true;
            }
        }
        return false;
    }